

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O2

void __thiscall btRaycastVehicle::updateVehicle(btRaycastVehicle *this,btScalar step)

{
  btRigidBody *pbVar1;
  btWheelInfo *pbVar2;
  int i;
  int iVar3;
  long lVar4;
  long lVar5;
  btScalar bVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar8;
  undefined4 uVar9;
  btVector3 bVar10;
  btScalar suspensionForce;
  btVector3 relpos;
  btVector3 impulse;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  btScalar local_88;
  undefined1 local_78 [8];
  btScalar bStack_70;
  btScalar bStack_6c;
  btVector3 local_68;
  btVector3 local_58;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_88 = step;
  for (iVar3 = 0; iVar3 < (this->m_wheelInfo).m_size; iVar3 = iVar3 + 1) {
    updateWheelTransform(this,iVar3,false);
  }
  bVar6 = btVector3::length(&this->m_chassisBody->m_linearVelocity);
  bVar6 = bVar6 * 3.6;
  this->m_currentVehicleSpeedKmHour = bVar6;
  pbVar1 = this->m_chassisBody;
  iVar3 = this->m_indexForwardAxis;
  uVar8 = 0;
  uVar9 = 0;
  if ((&(pbVar1->super_btCollisionObject).m_worldTransform.m_origin)[-1].m_floats[iVar3] *
      (pbVar1->m_linearVelocity).m_floats[2] +
      (pbVar1->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[iVar3] *
      (pbVar1->m_linearVelocity).m_floats[0] +
      (&(pbVar1->super_btCollisionObject).m_worldTransform.m_origin)[-2].m_floats[iVar3] *
      (pbVar1->m_linearVelocity).m_floats[1] < 0.0) {
    bVar6 = -bVar6;
    this->m_currentVehicleSpeedKmHour = bVar6;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < (this->m_wheelInfo).m_size; lVar5 = lVar5 + 1) {
    bVar6 = rayCast(this,(btWheelInfo *)
                         ((long)(((this->m_wheelInfo).m_data)->m_raycastInfo).m_contactNormalWS.
                                m_floats + lVar4));
    lVar4 = lVar4 + 0x128;
  }
  updateSuspension(this,bVar6);
  local_78._4_4_ = local_88;
  local_78._0_4_ = local_88;
  bStack_70 = local_88;
  bStack_6c = local_88;
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < (this->m_wheelInfo).m_size; lVar4 = lVar4 + 1) {
    pbVar2 = (this->m_wheelInfo).m_data;
    local_98 = *(float *)((long)(&pbVar2->m_wheelAxleCS + 6) + lVar5);
    uVar8 = 0;
    uVar9 = 0;
    fVar7 = *(float *)((long)(&pbVar2->m_wheelAxleCS + 3) + lVar5 + 0xc);
    if (fVar7 < local_98) {
      local_98 = fVar7;
    }
    bVar10 = operator*((btVector3 *)
                       ((long)(pbVar2->m_raycastInfo).m_contactNormalWS.m_floats + lVar5),&local_98)
    ;
    local_58.m_floats[1] = bVar10.m_floats[1] * (float)local_78._4_4_;
    local_58.m_floats[0] = bVar10.m_floats[0] * (float)local_78._0_4_;
    local_58.m_floats[2] = bVar10.m_floats[2] * local_88;
    local_58.m_floats[3] = 0.0;
    local_68 = operator-((btVector3 *)
                         ((long)(pbVar2->m_raycastInfo).m_contactPointWS.m_floats + lVar5),
                         &(this->m_chassisBody->super_btCollisionObject).m_worldTransform.m_origin);
    btRigidBody::applyImpulse(this->m_chassisBody,&local_58,&local_68);
    lVar5 = lVar5 + 0x128;
  }
  (*(this->super_btActionInterface)._vptr_btActionInterface[5])(local_88,this);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < (this->m_wheelInfo).m_size; lVar4 = lVar4 + 1) {
    pbVar2 = (this->m_wheelInfo).m_data;
    local_58 = operator-((btVector3 *)((long)(pbVar2->m_raycastInfo).m_hardPointWS.m_floats + lVar5)
                         ,&(this->m_chassisBody->super_btCollisionObject).m_worldTransform.m_origin)
    ;
    bVar10 = btRigidBody::getVelocityInLocalPoint(this->m_chassisBody,&local_58);
    if (*(bool *)((long)(&(pbVar2->m_raycastInfo).m_wheelAxleWS + 1) + lVar5) == true) {
      pbVar1 = this->m_chassisBody;
      iVar3 = this->m_indexForwardAxis;
      local_94 = (pbVar1->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[iVar3];
      local_8c = (&(pbVar1->super_btCollisionObject).m_worldTransform.m_origin)[-2].m_floats[iVar3];
      local_90 = (&(pbVar1->super_btCollisionObject).m_worldTransform.m_origin)[-1].m_floats[iVar3];
      uStack_40 = extraout_XMM0_Dc;
      local_48 = bVar10.m_floats._0_8_;
      uStack_3c = extraout_XMM0_Dd;
      bStack_70 = (btScalar)uVar8;
      local_78 = (undefined1  [8])bVar10.m_floats._8_8_;
      bStack_6c = (btScalar)uVar9;
      local_68.m_floats[0] =
           *(float *)((long)(pbVar2->m_raycastInfo).m_contactNormalWS.m_floats + lVar5 + 8) *
           local_90 +
           *(float *)((long)(pbVar2->m_raycastInfo).m_contactNormalWS.m_floats + lVar5) * local_94 +
           *(float *)((long)(pbVar2->m_raycastInfo).m_contactNormalWS.m_floats + lVar5 + 4) *
           local_8c;
      bVar10 = operator*((btVector3 *)
                         ((long)(pbVar2->m_raycastInfo).m_contactNormalWS.m_floats + lVar5),
                         local_68.m_floats);
      fVar7 = (((local_90 - bVar10.m_floats[2]) * (float)local_78._0_4_ +
               (local_94 - bVar10.m_floats[0]) * (float)local_48._0_4_ +
               (float)local_48._4_4_ * (local_8c - bVar10.m_floats[1])) * local_88) /
              *(float *)((long)(&pbVar2->m_wheelAxleCS + 1) + lVar5 + 8);
      *(float *)((long)(&pbVar2->m_wheelAxleCS + 3) + lVar5 + 4) = fVar7;
      *(float *)((long)(&pbVar2->m_wheelAxleCS + 3) + lVar5) =
           fVar7 + *(float *)((long)(&pbVar2->m_wheelAxleCS + 3) + lVar5);
      fVar7 = *(float *)((long)(&pbVar2->m_wheelAxleCS + 3) + lVar5 + 4);
      uVar8 = uStack_40;
      uVar9 = uStack_3c;
    }
    else {
      fVar7 = *(float *)((long)(&pbVar2->m_wheelAxleCS + 3) + lVar5 + 4);
      uVar8 = 0;
      uVar9 = 0;
      *(float *)((long)(&pbVar2->m_wheelAxleCS + 3) + lVar5) =
           *(float *)((long)(&pbVar2->m_wheelAxleCS + 3) + lVar5) + fVar7;
    }
    *(float *)((long)(&pbVar2->m_wheelAxleCS + 3) + lVar5 + 4) = fVar7 * 0.99;
    lVar5 = lVar5 + 0x128;
  }
  return;
}

Assistant:

void btRaycastVehicle::updateVehicle( btScalar step )
{
	{
		for (int i=0;i<getNumWheels();i++)
		{
			updateWheelTransform(i,false);
		}
	}


	m_currentVehicleSpeedKmHour = btScalar(3.6) * getRigidBody()->getLinearVelocity().length();
	
	const btTransform& chassisTrans = getChassisWorldTransform();

	btVector3 forwardW (
		chassisTrans.getBasis()[0][m_indexForwardAxis],
		chassisTrans.getBasis()[1][m_indexForwardAxis],
		chassisTrans.getBasis()[2][m_indexForwardAxis]);

	if (forwardW.dot(getRigidBody()->getLinearVelocity()) < btScalar(0.))
	{
		m_currentVehicleSpeedKmHour *= btScalar(-1.);
	}

	//
	// simulate suspension
	//
	
	int i=0;
	for (i=0;i<m_wheelInfo.size();i++)
	{
		//btScalar depth; 
		//depth = 
		rayCast( m_wheelInfo[i]);
	}

	updateSuspension(step);

	
	for (i=0;i<m_wheelInfo.size();i++)
	{
		//apply suspension force
		btWheelInfo& wheel = m_wheelInfo[i];
		
		btScalar suspensionForce = wheel.m_wheelsSuspensionForce;
		
		if (suspensionForce > wheel.m_maxSuspensionForce)
		{
			suspensionForce = wheel.m_maxSuspensionForce;
		}
		btVector3 impulse = wheel.m_raycastInfo.m_contactNormalWS * suspensionForce * step;
		btVector3 relpos = wheel.m_raycastInfo.m_contactPointWS - getRigidBody()->getCenterOfMassPosition();
		
		getRigidBody()->applyImpulse(impulse, relpos);
	
	}
	

	
	updateFriction( step);

	
	for (i=0;i<m_wheelInfo.size();i++)
	{
		btWheelInfo& wheel = m_wheelInfo[i];
		btVector3 relpos = wheel.m_raycastInfo.m_hardPointWS - getRigidBody()->getCenterOfMassPosition();
		btVector3 vel = getRigidBody()->getVelocityInLocalPoint( relpos );

		if (wheel.m_raycastInfo.m_isInContact)
		{
			const btTransform&	chassisWorldTransform = getChassisWorldTransform();

			btVector3 fwd (
				chassisWorldTransform.getBasis()[0][m_indexForwardAxis],
				chassisWorldTransform.getBasis()[1][m_indexForwardAxis],
				chassisWorldTransform.getBasis()[2][m_indexForwardAxis]);

			btScalar proj = fwd.dot(wheel.m_raycastInfo.m_contactNormalWS);
			fwd -= wheel.m_raycastInfo.m_contactNormalWS * proj;

			btScalar proj2 = fwd.dot(vel);
			
			wheel.m_deltaRotation = (proj2 * step) / (wheel.m_wheelsRadius);
			wheel.m_rotation += wheel.m_deltaRotation;

		} else
		{
			wheel.m_rotation += wheel.m_deltaRotation;
		}
		
		wheel.m_deltaRotation *= btScalar(0.99);//damping of rotation when not in contact

	}



}